

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

void __thiscall
llvm::DWARFUnit::DWARFUnit
          (DWARFUnit *this,DWARFContext *DC,DWARFSection *Section,DWARFUnitHeader *Header,
          DWARFDebugAbbrev *DA,DWARFSection *RS,DWARFSection *LocSection,StringRef SS,
          DWARFSection *SOS,DWARFSection *AOS,DWARFSection *LS,bool LE,bool IsDWO,
          DWARFUnitVector *UnitVector)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  size_t sVar3;
  SectionContribution *pSVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  DWARFUnitHeader *pDVar8;
  DWARFUnitHeader *pDVar9;
  
  this->_vptr_DWARFUnit = (_func_int **)&PTR__DWARFUnit_01078b08;
  this->Context = DC;
  this->InfoSection = Section;
  pDVar8 = Header;
  pDVar9 = &this->Header;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pDVar9->Offset = pDVar8->Offset;
    pDVar8 = (DWARFUnitHeader *)&pDVar8->FormParams;
    pDVar9 = (DWARFUnitHeader *)&pDVar9->FormParams;
  }
  this->Abbrev = DA;
  this->RangeSection = RS;
  (this->field_7).LocSection = LocSection;
  this->LineSection = LS;
  (this->StringSection).Data = SS.Data;
  (this->StringSection).Length = SS.Length;
  this->StringOffsetSection = SOS;
  this->AddrOffsetSection = AOS;
  this->AddrOffsetSectionBase = 0;
  this->isLittleEndian = LE;
  this->IsDWO = IsDWO;
  this->UnitVector = UnitVector;
  (this->StringOffsetsTableContribution).Storage.field_0.empty = '\0';
  (this->StringOffsetsTableContribution).Storage.hasVal = false;
  (this->RngListTable).Storage.field_0.empty = '\0';
  (this->RngListTable).Storage.hasVal = false;
  (this->BaseAddr).Storage.field_0.empty = '\0';
  (this->BaseAddr).Storage.hasVal = false;
  (this->DieArray).
  super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DieArray).
  super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DieArray).
  super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header;
  (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  clear(this);
  if (IsDWO) {
    sVar3 = (LocSection->Data).Length;
    (this->field_7).LocSection = (DWARFSection *)(LocSection->Data).Data;
    (this->field_7).LocSectionData.Length = sVar3;
    if (Header->IndexEntry != (Entry *)0x0) {
      pSVar4 = DWARFUnitIndex::Entry::getOffset(Header->IndexEntry,DW_SECT_LOC);
      if (pSVar4 != (SectionContribution *)0x0) {
        uVar2 = (this->field_7).LocSectionData.Length;
        uVar6 = (ulong)pSVar4->Offset;
        if (uVar2 < pSVar4->Offset) {
          uVar6 = uVar2;
        }
        uVar7 = uVar2 - uVar6;
        if ((ulong)pSVar4->Length <= uVar2 - uVar6) {
          uVar7 = (ulong)pSVar4->Length;
        }
        (this->field_7).LocSection =
             (DWARFSection *)((long)&(((this->field_7).LocSection)->Data).Data + uVar6);
        (this->field_7).LocSectionData.Length = uVar7;
      }
    }
  }
  return;
}

Assistant:

DWARFUnit::DWARFUnit(DWARFContext &DC, const DWARFSection &Section,
                     const DWARFUnitHeader &Header, const DWARFDebugAbbrev *DA,
                     const DWARFSection *RS, const DWARFSection *LocSection,
                     StringRef SS, const DWARFSection &SOS,
                     const DWARFSection *AOS, const DWARFSection &LS, bool LE,
                     bool IsDWO, const DWARFUnitVector &UnitVector)
    : Context(DC), InfoSection(Section), Header(Header), Abbrev(DA),
      RangeSection(RS), LocSection(LocSection), LineSection(LS),
      StringSection(SS), StringOffsetSection(SOS), AddrOffsetSection(AOS),
      isLittleEndian(LE), IsDWO(IsDWO), UnitVector(UnitVector) {
  clear();
  // For split DWARF we only need to keep track of the location list section's
  // data (no relocations), and if we are reading a package file, we need to
  // adjust the location list data based on the index entries.
  if (IsDWO) {
    LocSectionData = LocSection->Data;
    if (auto *IndexEntry = Header.getIndexEntry())
      if (const auto *C = IndexEntry->getOffset(DW_SECT_LOC))
        LocSectionData = LocSectionData.substr(C->Offset, C->Length);
  }
}